

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void free(void *__ptr)

{
  memdesc *desc_00;
  void *p;
  memdesc *pmVar1;
  memdesc *pmVar2;
  _Bool _Var3;
  int iVar4;
  memstate mVar5;
  void *p_1;
  memdesc *desc;
  guard *guard;
  void *p_local;
  
  if (__ptr != (void *)0x0) {
    _Var3 = use_hdmp();
    if (_Var3) {
      desc_00 = ((guard *)((long)__ptr + -0x10))->desc;
      mVar5 = get_state(desc_00);
      if (mVar5 != mem_allocated) {
        die("free() passed non-allocated memory");
      }
      if (desc_00->data != (guard *)((long)__ptr + -0x10)) {
        die("internal integrity error");
      }
      getstacktrace(desc_00->stack,(int)hdbg.maxframes);
      fill(desc_00->data + 1,(int)desc_00->len,0xdeaddead);
      set_state(desc_00,mem_free);
      LOCK(&heap_lock);
      hdbg.stats.free_calls = hdbg.stats.free_calls + 1;
      hdbg.stats.alloc_total = hdbg.stats.alloc_total - desc_00->len;
      if ((desc_00->node).tqe_next == (memdesc *)0x0) {
        hdbg.heap.tqh_last = (desc_00->node).tqe_prev;
      }
      else {
        (((desc_00->node).tqe_next)->node).tqe_prev = (desc_00->node).tqe_prev;
      }
      *(desc_00->node).tqe_prev = (desc_00->node).tqe_next;
      pmVar1 = hdbg.freelist.tqh_first;
      (desc_00->node).tqe_next = hdbg.freelist.tqh_first;
      pmVar2 = desc_00;
      if (pmVar1 != (memdesc *)0x0) {
        ((hdbg.freelist.tqh_first)->node).tqe_prev = (memdesc **)desc_00;
        pmVar2 = (memdesc *)hdbg.freelist.tqh_last;
      }
      hdbg.freelist.tqh_last = (memdesc **)pmVar2;
      hdbg.freelist.tqh_first = desc_00;
      (desc_00->node).tqe_prev = &hdbg.freelist.tqh_first;
      if (hdbg.freelistsize == hdbg.freelistmax) {
        p_1 = (hdbg.freelist.tqh_last[1]->node).tqe_next;
        if ((((memdesc *)p_1)->node).tqe_next == (memdesc *)0x0) {
          hdbg.freelist.tqh_last = (((memdesc *)p_1)->node).tqe_prev;
        }
        else {
          (((((memdesc *)p_1)->node).tqe_next)->node).tqe_prev = (((memdesc *)p_1)->node).tqe_prev;
        }
        *(((memdesc *)p_1)->node).tqe_prev = (((memdesc *)p_1)->node).tqe_next;
      }
      else {
        hdbg.freelistsize = hdbg.freelistsize + 1;
        p_1 = (void *)0x0;
      }
      UNLOCK(&heap_lock);
      if (p_1 != (void *)0x0) {
        p = *(void **)((long)p_1 + 0x28);
        free_desc((memdesc *)p_1);
        iVar4 = headroom(p);
        if (iVar4 == 0) {
          (*real_free)(p);
        }
      }
    }
    else {
      iVar4 = headroom(__ptr);
      if (iVar4 == 0) {
        (*real_free)(__ptr);
      }
    }
  }
  return;
}

Assistant:

void free(void *p) {
    if (p == 0)
        return;
    if (!use_hdmp()) {
        if (!headroom(p))
            real_free(p);
        return;
    }

    struct guard *guard = (struct guard *)p - 1;
    struct memdesc *desc = guard->desc;

    if (get_state(desc) != mem_allocated)
        die("free() passed non-allocated memory");
    if (desc->data != guard)
        die("internal integrity error");

    getstacktrace(desc->stack, hdbg.maxframes);
    fill(desc->data + 1, desc->len, 0xdeaddead);
    set_state(desc, mem_free);

    LOCK(&heap_lock);

    hdbg.stats.free_calls++;
    hdbg.stats.alloc_total -= desc->len;
    TAILQ_REMOVE(&hdbg.heap, desc, node);

    TAILQ_INSERT_HEAD(&hdbg.freelist, desc, node);
    // put this block on the freelist, and extract the oldest block if the list
    // is too big. We will actually free the oldest one now, so we have
    // maintained some hysteresis between the application calling free() and
    // actually freeing the memory.
    if (hdbg.freelistsize == hdbg.freelistmax) {
        desc = TAILQ_LAST(&hdbg.freelist, memdesc_list);
        TAILQ_REMOVE(&hdbg.freelist, desc, node);
    } else {
        hdbg.freelistsize++;
        desc = 0;
    }
    UNLOCK(&heap_lock);

    if (desc) {
        void *p = desc->base;
        free_desc(desc);
        if (!headroom(p))
            real_free(p);
    }
}